

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_log10_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  unkuint10 Var3;
  flag fVar4;
  int32_t iVar5;
  uint64_t uVar6;
  uint16_t uVar7;
  undefined8 extraout_RDX;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 b;
  floatx80 fVar8;
  floatx80 fVar9;
  floatx80 fVar10;
  floatx80 fVar11;
  floatx80 fp1;
  floatx80 fp0;
  int8_t user_rnd_prec;
  int8_t user_rnd_mode;
  uint64_t aSig;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  Var3 = a._0_10_;
  fVar9._10_6_ = 0;
  fVar9.low = (long)Var3;
  fVar9.high = (short)(Var3 >> 0x40);
  uVar6 = extractFloatx80Frac(fVar9);
  fVar10._10_6_ = 0;
  fVar10.low = (long)Var3;
  fVar10.high = (short)(Var3 >> 0x40);
  iVar5 = extractFloatx80Exp(fVar10);
  a_00._10_6_ = 0;
  a_00.low = (long)Var3;
  a_00.high = (short)(Var3 >> 0x40);
  fVar4 = extractFloatx80Sign(a_00);
  if (iVar5 == 0x7fff) {
    if ((uVar6 & 0x7fffffffffffffff) != 0) {
      a_01._10_6_ = 0;
      a_01.low = (long)Var3;
      a_01.high = (short)(Var3 >> 0x40);
      propagateFloatx80NaNOneArg(a_01,status);
    }
    if (fVar4 == '\0') {
      fVar8 = packFloatx80('\0',0x7fff,0);
      uVar7 = fVar8.high;
      goto LAB_008b2ee8;
    }
  }
  if ((iVar5 == 0) && (uVar6 == 0)) {
    float_raise_m68k('\x04',status);
    fVar8 = packFloatx80('\x01',0x7fff,0);
    uVar7 = fVar8.high;
  }
  else if (fVar4 == '\0') {
    cVar1 = status->float_rounding_mode;
    cVar2 = status->floatx80_rounding_precision;
    status->float_rounding_mode = '\0';
    status->floatx80_rounding_precision = 'P';
    a_02._10_6_ = 0;
    a_02.low = (long)Var3;
    a_02.high = (short)(Var3 >> 0x40);
    fVar9 = floatx80_logn_m68k(a_02,status);
    fVar10 = packFloatx80('\0',0x3ffd,0xde5bd8a937287195);
    status->float_rounding_mode = cVar1;
    status->floatx80_rounding_precision = cVar2;
    a_03._10_6_ = 0;
    a_03.low = (long)fVar9._0_10_;
    a_03.high = (short)(fVar9._0_10_ >> 0x40);
    b._10_6_ = 0;
    b.low = (long)fVar10._0_10_;
    b.high = (short)(fVar10._0_10_ >> 0x40);
    fVar9 = floatx80_mul_m68k(a_03,b,status);
    uVar7 = fVar9.high;
    float_raise_m68k(' ',status);
    fVar8._8_8_ = extraout_RDX;
    fVar8.low = fVar9.low;
  }
  else {
    float_raise_m68k('\x01',status);
    fVar8 = floatx80_default_nan_m68k(status);
    uVar7 = fVar8.high;
  }
LAB_008b2ee8:
  a_local._8_8_ = fVar8.low;
  fVar11._10_6_ = fVar8._10_6_;
  fVar11.high = uVar7;
  fVar11.low = a_local._8_8_;
  return fVar11;
}

Assistant:

floatx80 floatx80_log10(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    int8_t user_rnd_mode, user_rnd_prec;

    floatx80 fp0, fp1;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            propagateFloatx80NaNOneArg(a, status);
        }
        if (aSign == 0) {
            return packFloatx80(0, floatx80_infinity.high,
                                floatx80_infinity.low);
        }
    }

    if (aExp == 0 && aSig == 0) {
        float_raise(float_flag_divbyzero, status);
        return packFloatx80(1, floatx80_infinity.high,
                            floatx80_infinity.low);
    }

    if (aSign) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    fp0 = floatx80_logn(a, status);
    fp1 = packFloatx80(0, 0x3FFD, UINT64_C(0xDE5BD8A937287195)); /* INV_L10 */

    status->float_rounding_mode = user_rnd_mode;
    status->floatx80_rounding_precision = user_rnd_prec;

    a = floatx80_mul(fp0, fp1, status); /* LOGN(X)*INV_L10 */

    float_raise(float_flag_inexact, status);

    return a;
}